

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram.c
# Opt level: O2

_Bool all_values_iter_next(hdr_iter *iter)

{
  _Bool _Var1;
  
  _Var1 = move_next(iter);
  if (_Var1) {
    iter->value_iterated_from = iter->value_iterated_to;
    iter->value_iterated_to = iter->value;
  }
  return _Var1;
}

Assistant:

static bool all_values_iter_next(struct hdr_iter* iter)
{
    bool result = move_next(iter);

    if (result)
    {
        update_iterated_values(iter, iter->value);
    }

    return result;
}